

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffdkey(fitsfile *fptr,char *keyname,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  undefined1 auVar3 [16];
  int iVar4;
  size_t sVar5;
  char value [71];
  char message [81];
  char valstring [71];
  char comm [73];
  char local_188 [80];
  char local_138 [96];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  iVar4 = ffgkey(fptr,keyname,local_d8,local_88,status);
  if (iVar4 < 1) {
    pFVar2 = fptr->Fptr;
    auVar3 = SEXT816(pFVar2->nextkey - pFVar2->headstart[pFVar2->curhdu]) *
             SEXT816(0x6666666666666667);
    iVar4 = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
    ffdrec(fptr,iVar4,status);
    if (0 < *status) {
      return *status;
    }
    ffpmrk();
    ffc2s(local_d8,local_188,status);
    iVar1 = *status;
    if (iVar1 == 0xcc) {
      ffcmrk();
      *status = 0;
      return 0;
    }
    sVar5 = strlen(local_188);
    if ((int)sVar5 == 0) {
      return iVar1;
    }
    do {
      if (local_188[(int)sVar5 + -1] != '&') break;
      local_138[0] = '\0';
      ffgcnt(fptr,local_188,local_138,status);
      if (local_138[0] == '\0' && local_188[0] == '\0') break;
      ffdrec(fptr,iVar4,status);
      sVar5 = strlen(local_188);
    } while ((int)sVar5 != 0);
  }
  else {
    snprintf(local_138,0x51,"Could not find the %s keyword to delete (ffdkey)",keyname);
    ffpmsg(local_138);
  }
  return *status;
}

Assistant:

int ffdkey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, comm, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                keyname);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, value, nextcomm, status);
        if (*value || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}